

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdcpp.hpp
# Opt level: O1

unique_ptr<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
 __thiscall
so_5::stdcpp::
make_unique<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::disp_params_t>
          (stdcpp *this,disp_params_t *args)

{
  _Manager_type p_Var1;
  proxy_dispatcher_t *this_00;
  disp_params_t local_48;
  
  this_00 = (proxy_dispatcher_t *)operator_new(0x58);
  local_48.super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::active_group::disp_params_t>
  .m_flag = (args->
            super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::active_group::disp_params_t>
            ).m_flag;
  local_48.m_queue_params.m_lock_factory.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_48.m_queue_params.m_lock_factory.super__Function_base._M_functor._8_8_ = 0;
  local_48.m_queue_params.m_lock_factory.super__Function_base._M_manager = (_Manager_type)0x0;
  local_48.m_queue_params.m_lock_factory._M_invoker =
       (args->m_queue_params).m_lock_factory._M_invoker;
  p_Var1 = (args->m_queue_params).m_lock_factory.super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48.m_queue_params.m_lock_factory.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)&(args->m_queue_params).m_lock_factory.super__Function_base._M_functor;
    local_48.m_queue_params.m_lock_factory.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)
          ((long)&(args->m_queue_params).m_lock_factory.super__Function_base._M_functor + 8);
    (args->m_queue_params).m_lock_factory.super__Function_base._M_manager = (_Manager_type)0x0;
    (args->m_queue_params).m_lock_factory._M_invoker = (_Invoker_type)0x0;
    local_48.m_queue_params.m_lock_factory.super__Function_base._M_manager = p_Var1;
  }
  so_5::disp::active_group::impl::proxy_dispatcher_t::proxy_dispatcher_t(this_00,&local_48);
  *(proxy_dispatcher_t **)this = this_00;
  if (local_48.m_queue_params.m_lock_factory.super__Function_base._M_manager != (_Manager_type)0x0)
  {
    (*local_48.m_queue_params.m_lock_factory.super__Function_base._M_manager)
              ((_Any_data *)&local_48.m_queue_params,(_Any_data *)&local_48.m_queue_params,
               __destroy_functor);
  }
  return (__uniq_ptr_data<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< T >
make_unique( ARGS && ...args )
	{
		return std::unique_ptr< T >( new T( std::forward<ARGS>(args)... ) );
	}